

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Dual_Infeasibility
               (CUPDLPwork *work,cupdlp_float *x,cupdlp_float *ax,cupdlp_float primalObj,
               cupdlp_float *dDualInfeasObj,cupdlp_float *dDualInfeasRes)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  double *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  double *in_R8;
  double in_XMM0_Qa;
  cupdlp_float pBoundUbResSq;
  cupdlp_float pBoundLbResSq;
  cupdlp_float pConstrResSq;
  cupdlp_float pScale;
  CUPDLPscaling *scaling;
  CUPDLPresobj *resobj;
  CUPDLPproblem *problem;
  cupdlp_float *res;
  cupdlp_float *x_00;
  double dVar4;
  CUPDLPwork *w;
  
  plVar1 = (long *)*in_RDI;
  lVar2 = in_RDI[2];
  piVar3 = (int *)in_RDI[5];
  w = (CUPDLPwork *)0x3ff0000000000000;
  dVar4 = 0.0;
  x_00 = (cupdlp_float *)0x0;
  res = (cupdlp_float *)0x0;
  memcpy(*(void **)(lVar2 + 0xd0),in_RSI,(long)*(int *)(*plVar1 + 4) << 3);
  cupdlp_twoNorm(w,(cupdlp_int)((ulong)dVar4 >> 0x20),x_00,res);
  if ((double)w < 1e-08) {
    w = (CUPDLPwork *)0x3ff0000000000000;
  }
  cupdlp_scaleVector(w,dVar4,x_00,(cupdlp_int)((ulong)res >> 0x20));
  *in_RCX = ((in_XMM0_Qa - (double)plVar1[0xc]) / (double)plVar1[0xd]) / (double)w;
  memcpy(*(void **)(lVar2 + 0xd8),in_RDX,(long)*(int *)*plVar1 << 3);
  cupdlp_scaleVector(w,dVar4,x_00,(cupdlp_int)((ulong)res >> 0x20));
  cupdlp_projNeg(x_00,(cupdlp_int)((ulong)res >> 0x20));
  if (*piVar3 != 0) {
    cupdlp_edot(x_00,res,0);
  }
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)dVar4 >> 0x20),x_00,res);
  memcpy(*(void **)(lVar2 + 0xe0),*(void **)(lVar2 + 0xd0),(long)*(int *)(*plVar1 + 4) << 3);
  cupdlp_projNeg(x_00,(cupdlp_int)((ulong)res >> 0x20));
  cupdlp_edot(x_00,res,0);
  if (*piVar3 != 0) {
    cupdlp_ediv(x_00,res,0);
  }
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)dVar4 >> 0x20),x_00,res);
  memcpy(*(void **)(lVar2 + 0xe0),*(void **)(lVar2 + 0xd0),(long)*(int *)(*plVar1 + 4) << 3);
  cupdlp_projPos(x_00,(cupdlp_int)((ulong)res >> 0x20));
  cupdlp_edot(x_00,res,0);
  if (*piVar3 != 0) {
    cupdlp_ediv(x_00,res,0);
  }
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)dVar4 >> 0x20),x_00,res);
  dVar4 = sqrt(dVar4 + (double)x_00 + (double)res);
  *in_R8 = dVar4;
  return;
}

Assistant:

void PDHG_Compute_Dual_Infeasibility(CUPDLPwork *work, const cupdlp_float *x,
                                     const cupdlp_float *ax,
                                     const cupdlp_float primalObj,
                                     cupdlp_float *dDualInfeasObj,
                                     cupdlp_float *dDualInfeasRes) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;
  cupdlp_float pScale = 1.0;
  cupdlp_float pConstrResSq = 0.0;
  cupdlp_float pBoundLbResSq = 0.0;
  cupdlp_float pBoundUbResSq = 0.0;

  #if !defined(CUPDLP_CPU) && USE_KERNELS
  // x ray
  cupdlp_twoNorm(work, problem->data->nCols, x, &pScale);
  // pScale /= sqrt(problem->data->nCols);
  if (pScale < 1e-8) {
    pScale = 1.0;
  }

  // primal obj
  *dDualInfeasObj =
      (primalObj - problem->offset) / problem->sense_origin / pScale;

  // primal constraints [Ax, min(Gx, 0)]
  cupdlp_dual_infeasibility_kernel_constr_cuda(work->buffer2, ax,
                                              work->rowScale, 1.0 / pScale,
                                              scaling->ifScaled,
                                              problem->nEqs,
                                              problem->data->nRows);
  cupdlp_twoNormSquared(work, problem->data->nRows, work->buffer2,
                        &pConstrResSq);

  // primal bound
  // lb
  cupdlp_dual_infeasibility_kernel_lb_cuda(work->buffer2, x,
                                           problem->hasLower,
                                           work->colScale,
                                           1.0 / pScale, scaling->ifScaled,
                                           problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nCols, work->buffer2,
                        &pBoundLbResSq);
  // ub
  cupdlp_dual_infeasibility_kernel_ub_cuda(work->buffer2, x,
                                           problem->hasUpper,
                                           work->colScale,
                                           1.0 / pScale, scaling->ifScaled,
                                           problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nCols, work->buffer2,
                        &pBoundUbResSq);

  // sum up
  *dDualInfeasRes = sqrt(pConstrResSq + pBoundLbResSq + pBoundUbResSq);

#else

  // x ray
  CUPDLP_COPY_VEC(resobj->primalInfeasRay, x, cupdlp_float,
                  problem->data->nCols);
  cupdlp_twoNorm(work, problem->data->nCols, resobj->primalInfeasRay, &pScale);
  // pScale /= sqrt(problem->data->nCols);
  if (pScale < 1e-8) {
    pScale = 1.0;
  }
  cupdlp_scaleVector(work, 1.0 / pScale, resobj->primalInfeasRay,
                     problem->data->nCols);

  // primal obj
  *dDualInfeasObj =
      (primalObj - problem->offset) / problem->sense_origin / pScale;

  // primal constraints [Ax, min(Gx, 0)]
  CUPDLP_COPY_VEC(resobj->primalInfeasConstr, ax, cupdlp_float,
                  problem->data->nRows);
  cupdlp_scaleVector(work, 1.0 / pScale, resobj->primalInfeasConstr,
                     problem->data->nRows);
  cupdlp_projNeg(resobj->primalInfeasConstr + problem->nEqs,
                 problem->data->nRows - problem->nEqs);
  if (scaling->ifScaled) {
    cupdlp_edot(resobj->primalInfeasConstr, work->rowScale,
                problem->data->nRows);
  }
  cupdlp_twoNormSquared(work, problem->data->nRows, resobj->primalInfeasConstr,
                        &pConstrResSq);

  // primal bound
  // lb
  CUPDLP_COPY_VEC(resobj->primalInfeasBound, resobj->primalInfeasRay,
                  cupdlp_float, problem->data->nCols);
  cupdlp_projNeg(resobj->primalInfeasBound, problem->data->nCols);
  cupdlp_edot(resobj->primalInfeasBound, problem->hasLower,
              problem->data->nCols);
  if (scaling->ifScaled) {
    cupdlp_ediv(resobj->primalInfeasBound, work->colScale,
                problem->data->nCols);
  }
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->primalInfeasBound,
                        &pBoundLbResSq);
  // ub
  CUPDLP_COPY_VEC(resobj->primalInfeasBound, resobj->primalInfeasRay,
                  cupdlp_float, problem->data->nCols);
  cupdlp_projPos(resobj->primalInfeasBound, problem->data->nCols);
  cupdlp_edot(resobj->primalInfeasBound, problem->hasUpper,
              problem->data->nCols);
  if (scaling->ifScaled) {
    cupdlp_ediv(resobj->primalInfeasBound, work->colScale,
                problem->data->nCols);
  }
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->primalInfeasBound,
                        &pBoundUbResSq);

  // sum up
  *dDualInfeasRes = sqrt(pConstrResSq + pBoundLbResSq + pBoundUbResSq);

#endif
}